

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O2

bool __thiscall
ON_ArchivableDictionaryPrivate::TrySetValue<ON_UUID_struct>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,ON_UUID_struct *value)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  ON_wString OVar3;
  int iVar4;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  _Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar6;
  ON_wString local_30;
  __uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_> local_28;
  
  ON_wString::ON_wString(&local_30,key);
  local_28._M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
  super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl =
       (tuple<DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>)
       (_Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>)0x0;
  pVar6 = std::
          _Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
          ::
          _M_insert_unique<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>
                    ((_Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                      *)&this->m_map,
                     (pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
                      *)&local_30);
  _Var5 = pVar6.first._M_node;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  ~pair((pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
         *)&local_30);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar4 = (**(code **)(*(long *)_Var5._M_node[1]._M_parent + 0x10))();
    if (iVar4 != 0xb) {
      return false;
    }
    p_Var1 = _Var5._M_node[1]._M_parent;
    p_Var2 = *(_Base_ptr *)value->Data4;
    p_Var1->_M_parent = *(_Base_ptr *)value;
    p_Var1->_M_left = p_Var2;
  }
  else {
    std::make_unique<Entry<ON_UUID_struct>,ON_UUID_struct_const&>((ON_UUID_struct *)&local_30);
    OVar3.m_s = local_30.m_s;
    local_30.m_s = (wchar_t *)0x0;
    p_Var1 = _Var5._M_node[1]._M_parent;
    _Var5._M_node[1]._M_parent = (_Base_ptr)OVar3.m_s;
    if ((p_Var1 != (_Base_ptr)0x0) &&
       ((**(code **)(*(long *)p_Var1 + 8))(), local_30.m_s != (wchar_t *)0x0)) {
      (**(code **)(*(long *)local_30.m_s + 8))();
    }
  }
  return true;
}

Assistant:

bool TrySetValue(const wchar_t* key, const V& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (r.second)
    {
      entry_ptr = make_entry(value);
      return true;
    }
    else if (entry_ptr->EntryType() == Entry<V>::Type)
    {
      static_cast<Entry<V>*>(entry_ptr.get())->Value() = value;
      return true;
    }

    return false;
  }